

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int __thiscall CGraph::solve(CGraph *this,int room)

{
  int iVar1;
  reference pvVar2;
  ostream *poVar3;
  int *piVar4;
  int local_34;
  int local_30;
  int local_2c;
  const_reference pvStack_28;
  int result;
  CNode *n;
  CGraph *pCStack_18;
  int room_local;
  CGraph *this_local;
  
  n._4_4_ = room;
  pCStack_18 = this;
  pvVar2 = std::vector<int,_std::allocator<int>_>::operator[](&this->m_weights,(long)room);
  if (*pvVar2 == -1) {
    pvStack_28 = std::vector<CGraph::CNode,_std::allocator<CGraph::CNode>_>::operator[]
                           (&this->m_building,(long)n._4_4_);
    local_2c = CNode::weight(pvStack_28);
    poVar3 = std::operator<<((ostream *)&std::cerr,"tn ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,n._4_4_);
    poVar3 = std::operator<<(poVar3," ");
    iVar1 = CNode::top(pvStack_28);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar1);
    poVar3 = std::operator<<(poVar3," ");
    iVar1 = CNode::right(pvStack_28);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar1);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    iVar1 = CNode::top(pvStack_28);
    if ((iVar1 == 0) && (iVar1 = CNode::right(pvStack_28), iVar1 != 0)) {
      iVar1 = CNode::right(pvStack_28);
      iVar1 = solve(this,iVar1);
      local_2c = iVar1 + local_2c;
    }
    else {
      iVar1 = CNode::top(pvStack_28);
      if ((iVar1 == 0) || (iVar1 = CNode::right(pvStack_28), iVar1 != 0)) {
        iVar1 = CNode::top(pvStack_28);
        if ((iVar1 != 0) && (iVar1 = CNode::right(pvStack_28), iVar1 != 0)) {
          iVar1 = CNode::top(pvStack_28);
          local_30 = solve(this,iVar1);
          iVar1 = CNode::right(pvStack_28);
          local_34 = solve(this,iVar1);
          piVar4 = std::max<int>(&local_30,&local_34);
          local_2c = *piVar4 + local_2c;
        }
      }
      else {
        iVar1 = CNode::top(pvStack_28);
        iVar1 = solve(this,iVar1);
        local_2c = iVar1 + local_2c;
      }
    }
    poVar3 = std::operator<<((ostream *)&std::cerr,"fr ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,n._4_4_);
    poVar3 = std::operator<<(poVar3," ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_2c);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    iVar1 = local_2c;
    pvVar2 = std::vector<int,_std::allocator<int>_>::operator[](&this->m_weights,(long)n._4_4_);
    *pvVar2 = iVar1;
    this_local._4_4_ = local_2c;
  }
  else {
    pvVar2 = std::vector<int,_std::allocator<int>_>::operator[](&this->m_weights,(long)n._4_4_);
    this_local._4_4_ = *pvVar2;
  }
  return this_local._4_4_;
}

Assistant:

int solve(int room) const
        {
            if (-1 != m_weights[room])
            {
                return m_weights[room];
            }
            const CNode& n = m_building[room];
            int result = n.weight();
            std::cerr << "tn " << room << " " << n.top() << " " << n.right() << std::endl;
            if (0 == n.top() && 0 != n.right())
            {
                result += solve(n.right());
            } else if (0 != n.top() && 0 == n.right())
            {
                result += solve(n.top());
            } else if (0 != n.top() && 0 != n.right())
            {
                result += std::max(solve(n.top()), solve(n.right()));
            } else  // both is zero
            {
                // nothing
            }
            std::cerr << "fr " << room << " " << result << std::endl;
            m_weights[room] = result;
            return result;
        }